

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O3

void __thiscall
OpenMD::RestraintForceModifier::~RestraintForceModifier(RestraintForceModifier *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppRVar2;
  RestWriter *this_00;
  pointer pcVar3;
  pointer ppSVar4;
  pointer ppMVar5;
  Restraint **elem;
  pointer ppRVar6;
  
  (this->super_ForceModifier)._vptr_ForceModifier =
       (_func_int **)&PTR__RestraintForceModifier_002f6bb8;
  ppRVar2 = (this->restraints_).
            super__Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppRVar6 = (this->restraints_).
                 super__Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppRVar6 != ppRVar2; ppRVar6 = ppRVar6 + 1
      ) {
    if (*ppRVar6 != (Restraint *)0x0) {
      (*(*ppRVar6)->_vptr_Restraint[1])();
    }
  }
  this_00 = this->restOut;
  if (this_00 != (RestWriter *)0x0) {
    RestWriter::~RestWriter(this_00);
  }
  operator_delete(this_00,0x18);
  pcVar3 = (this->restOutput_)._M_dataplus._M_p;
  paVar1 = &(this->restOutput_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  ::~vector(&this->restInfo_);
  ppSVar4 = (this->restrainedObjs_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->restrainedObjs_).
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  ppMVar5 = (this->restrainedMols_).
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar5 != (pointer)0x0) {
    operator_delete(ppMVar5,(long)(this->restrainedMols_).
                                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar5
                   );
  }
  ppRVar6 = (this->restraints_).
            super__Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar6 != (pointer)0x0) {
    operator_delete(ppRVar6,(long)(this->restraints_).
                                  super__Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar6
                   );
    return;
  }
  return;
}

Assistant:

RestraintForceModifier::~RestraintForceModifier() {
    Utils::deletePointers(restraints_);

    delete restOut;
  }